

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

Vec_Int_t * Vec_IntDup(Vec_Int_t *pVec)

{
  Vec_Int_t *pVVar1;
  int *local_20;
  Vec_Int_t *p;
  Vec_Int_t *pVec_local;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  pVVar1->nSize = pVec->nSize;
  pVVar1->nCap = pVec->nSize;
  if (pVVar1->nCap == 0) {
    local_20 = (int *)0x0;
  }
  else {
    local_20 = (int *)malloc((long)pVVar1->nCap << 2);
  }
  pVVar1->pArray = local_20;
  memcpy(pVVar1->pArray,pVec->pArray,(long)pVec->nSize << 2);
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntDup( Vec_Int_t * pVec )
{
    Vec_Int_t * p;
    p = ABC_ALLOC( Vec_Int_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nSize;
    p->pArray = p->nCap? ABC_ALLOC( int, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(int) * (size_t)pVec->nSize );
    return p;
}